

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

int Io_MvParseLineNamesMv(Io_MvMod_t *p,char *pLine,int fReset)

{
  int *piVar1;
  int iVar2;
  char cVar3;
  Io_MvMan_t *pIVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vTokens;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *vFunc;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pFanin;
  int i;
  ulong uVar11;
  ulong uVar12;
  byte *pOutput;
  uint uVar13;
  void **ppvVar14;
  char *pcVar15;
  char *__s;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  
  pIVar4 = p->pMan;
  if (pIVar4->fBlifMv == 0) {
    __assert_fail("p->pMan->fBlifMv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                  ,0x777,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
  }
  pVVar5 = pIVar4->vTokens;
  vTokens = pIVar4->vTokens2;
  pcVar17 = pLine + -1;
  do {
    pcVar15 = pcVar17;
    cVar3 = pcVar15[2];
    if (cVar3 == '\0') {
      pcVar17 = (char *)0x0;
      goto LAB_002d1d87;
    }
    pcVar17 = pcVar15 + 1;
  } while ((cVar3 != '>') || (pcVar15[1] != '-'));
  pcVar17[0] = ' ';
  pcVar17[1] = ' ';
  pIVar4 = p->pMan;
  if (pIVar4->fBlifMv == 0) {
    uVar8 = (ulong)pIVar4->vLines->nSize;
    uVar12 = 0xffffffff;
    if (0 < (long)uVar8) {
      uVar11 = 0;
      do {
        if (pLine < pIVar4->vLines->pArray[uVar11]) {
          uVar12 = uVar11 & 0xffffffff;
          break;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    sprintf(pIVar4->sError,"Line %d: Multi-output node symbol (->) in binary BLIF file.",uVar12);
    return 0;
  }
LAB_002d1d87:
  Io_MvSplitIntoTokens(pVVar5,pLine,'\0');
  uVar13 = pVVar5->nSize;
  if (fReset == 0) {
    if (0 < (int)uVar13) {
      ppvVar14 = pVVar5->pArray;
      pcVar15 = (char *)*ppvVar14;
      iVar6 = strcmp(pcVar15,"names");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar15,"table"), iVar6 != 0)) {
        __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"table\")"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                      ,0x784,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
      }
      goto LAB_002d1e62;
    }
  }
  else if (0 < (int)uVar13) {
    ppvVar14 = pVVar5->pArray;
    pcVar15 = (char *)*ppvVar14;
    if (((*pcVar15 != 'r') || (pcVar15[1] != '\0')) && (iVar6 = strcmp(pcVar15,"reset"), iVar6 != 0)
       ) {
      __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"r\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"reset\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x782,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
    }
LAB_002d1e62:
    uVar16 = uVar13 - 2;
    uVar18 = 1;
    if ((cVar3 != '\0') && (2 < uVar13)) {
      uVar8 = (ulong)uVar16 + 1;
      uVar18 = 1;
      do {
        uVar16 = uVar16 - (pcVar17 < ppvVar14[uVar8 - 1]);
        uVar18 = uVar18 + (pcVar17 < ppvVar14[uVar8 - 1]);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    pcVar17 = (char *)ppvVar14[(ulong)uVar13 - 1];
    sVar9 = strlen(pcVar17);
    pOutput = (byte *)(pcVar17 + sVar9);
    do {
      uVar8 = (ulong)*pOutput;
      if (uVar8 < 0x2f) {
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
          if ((uVar8 == 0x2e) && (pOutput[1] != 100)) goto code_r0x002d1ee0;
        }
        else {
          *pOutput = 0;
        }
      }
      pOutput = pOutput + 1;
    } while( true );
  }
LAB_002d2444:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
code_r0x002d1ee0:
  Io_MvCollectTokens(vTokens,pcVar17 + sVar9,(char *)pOutput);
  iVar6 = vTokens->nSize;
  if (0 < iVar6) {
    pcVar15 = (char *)*vTokens->pArray;
    if (*pcVar15 == '.') {
      if (pcVar15[1] != 'd') {
        __assert_fail("pFirst[1] == \'d\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                      ,0x797,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
      }
      iVar6 = iVar6 + ~uVar18;
    }
    iVar2 = uVar18 + uVar16;
    if (iVar6 % iVar2 != 0) {
      pVVar5 = p->pMan->vLines;
      __s = p->pMan->sError;
      uVar8 = (ulong)pVVar5->nSize;
      uVar12 = 0xffffffff;
      if (0 < (long)uVar8) {
        uVar11 = 0;
        do {
          if (pcVar15 < pVVar5->pArray[uVar11]) {
            uVar12 = uVar11 & 0xffffffff;
            break;
          }
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      pcVar15 = 
      "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)"
      ;
      goto LAB_002d2011;
    }
    if ((uVar16 != 0) || (iVar6 / iVar2 < 2)) {
      uVar8 = 1;
      if (1 < (int)uVar18) {
        uVar8 = (ulong)uVar18;
      }
      uVar12 = 0;
      do {
        uVar13 = (pVVar5->nSize - uVar18) + (int)uVar12;
        if (((int)uVar13 < 0) || (pVVar5->nSize <= (int)uVar13)) goto LAB_002d2444;
        pcVar17 = (char *)pVVar5->pArray[uVar13];
        if (fReset == 0) {
          pAVar10 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar17);
          if (0 < (pAVar10->vFanins).nSize) {
            pVVar5 = p->pMan->vLines;
            __s = p->pMan->sError;
            uVar8 = (ulong)pVVar5->nSize;
            uVar12 = 0xffffffff;
            if ((long)uVar8 < 1) goto LAB_002d2438;
            uVar11 = 0;
            goto LAB_002d2418;
          }
          pAVar10 = Io_ReadCreateNode(p->pNtk,pcVar17,(char **)(pVVar5->pArray + 1),uVar16);
        }
        else {
          pAVar10 = Abc_NtkFindNet(p->pNtk,pcVar17);
          if (pAVar10 == (Abc_Obj_t *)0x0) {
            pVVar5 = p->pMan->vLines;
            __s = p->pMan->sError;
            uVar8 = (ulong)pVVar5->nSize;
            uVar12 = 0xffffffff;
            if ((long)uVar8 < 1) goto LAB_002d242a;
            uVar11 = 0;
            goto LAB_002d23e5;
          }
          pAVar10 = Io_MvParseAddResetCircuit(p,pcVar17);
          pNtk = p->pNtk;
          pcVar17 = Abc_ObjName(pAVar10);
          pAVar10 = Io_ReadCreateNode(pNtk,pcVar17,(char **)(pVVar5->pArray + 1),uVar16);
          if (pVVar5->nSize - 2U != uVar16) {
            __assert_fail("nInputs == Vec_PtrSize(vTokens) - 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x750,
                          "int Io_MvParseLineNamesMvOne(Io_MvMod_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int, int, int)"
                         );
          }
        }
        vFunc = p->pMan->vFunc;
        vFunc->nSize = 0;
        iVar6 = vTokens->nSize;
        if (iVar6 < 1) goto LAB_002d2444;
        uVar13 = 0;
        if (**vTokens->pArray == '.') {
          iVar6 = 0;
          pcVar17 = vFunc->pArray;
          if (vFunc->nCap == 0) {
            if (pcVar17 == (char *)0x0) {
              pcVar17 = (char *)malloc(0x10);
              iVar6 = 0;
            }
            else {
              pcVar17 = (char *)realloc(pcVar17,0x10);
              iVar6 = vFunc->nSize;
            }
            vFunc->pArray = pcVar17;
            vFunc->nCap = 0x10;
          }
          vFunc->nSize = iVar6 + 1;
          pcVar17[iVar6] = 'd';
          if ((long)vTokens->nSize <= (long)(uVar12 + 1)) goto LAB_002d2444;
          iVar6 = Io_MvParseLiteralMv(p,pAVar10,(char *)vTokens->pArray[uVar12 + 1],vFunc,-1);
          if (iVar6 == 0) {
LAB_002d238e:
            (pAVar10->field_5).pData = (void *)0x0;
            return 0;
          }
          iVar6 = vTokens->nSize;
          uVar13 = uVar18 + 1;
        }
        if ((int)uVar13 < iVar6) {
          do {
            if (0 < (int)uVar16) {
              if ((int)uVar13 < 0) goto LAB_002d2444;
              uVar11 = 0;
              do {
                if (vTokens->nSize <= (int)(uVar13 + (int)uVar11)) goto LAB_002d2444;
                iVar6 = Io_MvParseLiteralMv(p,pAVar10,(char *)vTokens->pArray[uVar13 + uVar11],vFunc
                                            ,(int)uVar11);
                if (iVar6 == 0) goto LAB_002d238e;
                uVar11 = uVar11 + 1;
              } while (uVar16 != uVar11);
            }
            uVar7 = (int)uVar12 + uVar16 + uVar13;
            if (((int)uVar7 < 0) || (vTokens->nSize <= (int)uVar7)) goto LAB_002d2444;
            iVar6 = Io_MvParseLiteralMv(p,pAVar10,(char *)vTokens->pArray[uVar7],vFunc,-1);
            if (iVar6 == 0) goto LAB_002d238e;
            uVar13 = uVar13 + iVar2;
          } while ((int)uVar13 < vTokens->nSize);
        }
        uVar13 = vFunc->nSize;
        if (uVar13 == vFunc->nCap) {
          if ((int)uVar13 < 0x10) {
            if (vFunc->pArray == (char *)0x0) {
              pcVar17 = (char *)malloc(0x10);
            }
            else {
              pcVar17 = (char *)realloc(vFunc->pArray,0x10);
            }
            vFunc->pArray = pcVar17;
            vFunc->nCap = 0x10;
          }
          else {
            sVar9 = (ulong)uVar13 * 2;
            if (vFunc->pArray == (char *)0x0) {
              pcVar17 = (char *)malloc(sVar9);
            }
            else {
              pcVar17 = (char *)realloc(vFunc->pArray,sVar9);
            }
            vFunc->pArray = pcVar17;
            vFunc->nCap = (int)sVar9;
          }
        }
        else {
          pcVar17 = vFunc->pArray;
        }
        iVar6 = vFunc->nSize;
        vFunc->nSize = iVar6 + 1;
        pcVar17[iVar6] = '\0';
        pcVar17 = vFunc->pArray;
        (pAVar10->field_5).pData = pcVar17;
        if (pcVar17 == (char *)0x0) {
          return 0;
        }
        pcVar17 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,pcVar17);
        (pAVar10->field_5).pData = pcVar17;
        uVar12 = uVar12 + 1;
        if (uVar12 == uVar8) {
          return 1;
        }
      } while( true );
    }
    uVar13 = 1;
    if (1 < (int)uVar18) {
      uVar13 = uVar18;
    }
    iVar6 = -uVar18;
    while( true ) {
      uVar16 = iVar6 + pVVar5->nSize;
      if (((int)uVar16 < 0) || (pVVar5->nSize <= (int)uVar16)) break;
      pcVar17 = (char *)pVVar5->pArray[uVar16];
      pAVar10 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar17);
      if (fReset != 0) {
        if (p->pResetLatch == (Abc_Obj_t *)0x0) {
          __assert_fail("p->pResetLatch != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                        ,0x7ae,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
        }
        pAVar10 = Io_MvParseAddResetCircuit(p,pcVar17);
      }
      piVar1 = &p->pMan->nNDnodes;
      *piVar1 = *piVar1 + 1;
      pFanin = Abc_NtkCreateNodeConst0(p->pNtk);
      Abc_ObjAddFanin(pAVar10,pFanin);
      iVar6 = iVar6 + 1;
      uVar13 = uVar13 - 1;
      if (uVar13 == 0) {
        return 1;
      }
    }
  }
  goto LAB_002d2444;
  while (uVar11 = uVar11 + 1, uVar8 != uVar11) {
LAB_002d2418:
    if (pcVar17 < pVVar5->pArray[uVar11]) {
      uVar12 = uVar11 & 0xffffffff;
      break;
    }
  }
LAB_002d2438:
  pcVar15 = "Line %d: Signal \"%s\" is defined more than once.";
  goto LAB_002d2011;
  while (uVar11 = uVar11 + 1, uVar8 != uVar11) {
LAB_002d23e5:
    if (pcVar17 < pVVar5->pArray[uVar11]) {
      uVar12 = uVar11 & 0xffffffff;
      break;
    }
  }
LAB_002d242a:
  pcVar15 = "Line %d: Latch with output signal \"%s\" does not exist.";
LAB_002d2011:
  sprintf(__s,pcVar15,uVar12,pcVar17);
  return 0;
}

Assistant:

static int Io_MvParseLineNamesMv( Io_MvMod_t * p, char * pLine, int fReset )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Vec_Ptr_t * vTokens2 = p->pMan->vTokens2;
    Abc_Obj_t * pNet;
    char * pName, * pFirst, * pArrow;
    int nInputs, nOutputs, nLiterals, nLines, i;
    assert( p->pMan->fBlifMv );
    // get the arrow if it is present
    pArrow = Io_MvFindArrow( pLine );
    if ( !p->pMan->fBlifMv && pArrow ) 
    {
        sprintf( p->pMan->sError, "Line %d: Multi-output node symbol (->) in binary BLIF file.", Io_MvGetLine(p->pMan, pLine) );
        return 0;
    }
    // split names line into tokens
    Io_MvSplitIntoTokens( vTokens, pLine, '\0' );
    if ( fReset )
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "r") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "reset") );
    else
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "names") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "table") );
    // find the number of inputs and outputs
    nInputs  = Vec_PtrSize(vTokens) - 2;
    nOutputs = 1;
    if ( pArrow != NULL )
    {
        for ( i = Vec_PtrSize(vTokens) - 2; i >= 1; i-- )
            if ( pArrow < (char*)Vec_PtrEntry(vTokens,i) )
            {
                nInputs--;
                nOutputs++;
            }
    }
    // split table into tokens
    pName = (char *)Vec_PtrEntryLast( vTokens );
    Io_MvSplitIntoTokensMv( vTokens2, pName + strlen(pName) );
    pFirst = (char *)Vec_PtrEntry( vTokens2, 0 );
    if ( pFirst[0] == '.' )
    {
        assert( pFirst[1] == 'd' );
        nLiterals = Vec_PtrSize(vTokens2) - 1 - nOutputs;
    }
    else
        nLiterals = Vec_PtrSize(vTokens2);
    // check the number of lines
    if ( nLiterals % (nInputs + nOutputs) != 0 )
    {
        sprintf( p->pMan->sError, "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)", Io_MvGetLine(p->pMan, pFirst), pName );
        return 0;
    }
    // check for the ND table
    nLines = nLiterals / (nInputs + nOutputs);
    if ( nInputs == 0 && nLines > 1 )
    {
        // add the outputs to the PIs
        for ( i = 0; i < nOutputs; i++ )
        {
            pName = (char *)Vec_PtrEntry( vTokens, Vec_PtrSize(vTokens) - nOutputs + i );
            // get the net corresponding to this node
            pNet = Abc_NtkFindOrCreateNet(p->pNtk, pName);
            if ( fReset )
            {
                assert( p->pResetLatch != NULL );
                // construct the reset circuit and get the reset net feeding into it
                pNet = Io_MvParseAddResetCircuit( p, pName );
            }
            // add the new PI node
//            Abc_ObjAddFanin( pNet, Abc_NtkCreatePi(p->pNtk) );
//            fprintf( stdout, "Io_ReadBlifMv(): Adding PI for internal non-deterministic node \"%s\".\n", pName );
            p->pMan->nNDnodes++;
            Abc_ObjAddFanin( pNet, Abc_NtkCreateNodeConst0(p->pNtk) );
        }
        return 1;
    }
    // iterate through the outputs
    for ( i = 0; i < nOutputs; i++ )
    {
        if ( !Io_MvParseLineNamesMvOne( p, vTokens, vTokens2, nInputs, nOutputs, i, fReset ) )
            return 0;
    }
    return 1;
}